

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

UBool u_strHasMoreChar32Than_63(UChar *s,int32_t length,int32_t number)

{
  UBool UVar1;
  int iVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  bool bVar5;
  
  UVar1 = '\x01';
  if (-1 < number) {
    if (-2 < length && s != (UChar *)0x0) {
      if (length == -1) {
        while (pUVar4 = s, *pUVar4 != L'\0') {
          bVar5 = number == 0;
          number = number + -1;
          if (bVar5) {
            return '\x01';
          }
          s = pUVar4 + 1;
          if (((*pUVar4 & 0xfc00U) == 0xd800) && ((pUVar4[1] & 0xfc00U) == 0xdc00)) {
            s = pUVar4 + 2;
          }
        }
      }
      else {
        if ((uint)number < length + 1U >> 1) {
          return '\x01';
        }
        iVar2 = length - number;
        if (iVar2 != 0 && number <= length) {
          pUVar4 = s;
          while (pUVar3 = pUVar4, pUVar3 != s + (uint)length) {
            bVar5 = number == 0;
            number = number + -1;
            if (bVar5) {
              return '\x01';
            }
            pUVar4 = pUVar3 + 1;
            if ((pUVar4 != s + (uint)length && (*pUVar3 & 0xfc00U) == 0xd800) &&
               ((*pUVar4 & 0xfc00U) == 0xdc00)) {
              if (iVar2 < 2) break;
              iVar2 = iVar2 + -1;
              pUVar4 = pUVar3 + 2;
            }
          }
        }
      }
    }
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

U_CAPI UBool U_EXPORT2
u_strHasMoreChar32Than(const UChar *s, int32_t length, int32_t number) {

    if(number<0) {
        return TRUE;
    }
    if(s==NULL || length<-1) {
        return FALSE;
    }

    if(length==-1) {
        /* s is NUL-terminated */
        UChar c;

        /* count code points until they exceed */
        for(;;) {
            if((c=*s++)==0) {
                return FALSE;
            }
            if(number==0) {
                return TRUE;
            }
            if(U16_IS_LEAD(c) && U16_IS_TRAIL(*s)) {
                ++s;
            }
            --number;
        }
    } else {
        /* length>=0 known */
        const UChar *limit;
        int32_t maxSupplementary;

        /* s contains at least (length+1)/2 code points: <=2 UChars per cp */
        if(((length+1)/2)>number) {
            return TRUE;
        }

        /* check if s does not even contain enough UChars */
        maxSupplementary=length-number;
        if(maxSupplementary<=0) {
            return FALSE;
        }
        /* there are maxSupplementary=length-number more UChars than asked-for code points */

        /*
         * count code points until they exceed and also check that there are
         * no more than maxSupplementary supplementary code points (UChar pairs)
         */
        limit=s+length;
        for(;;) {
            if(s==limit) {
                return FALSE;
            }
            if(number==0) {
                return TRUE;
            }
            if(U16_IS_LEAD(*s++) && s!=limit && U16_IS_TRAIL(*s)) {
                ++s;
                if(--maxSupplementary<=0) {
                    /* too many pairs - too few code points */
                    return FALSE;
                }
            }
            --number;
        }
    }
}